

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

error_or<int> * __thiscall
pstore::http::send_message<WsServer_Ping_Test::TestBody()::__2,int>
          (error_or<int> *__return_storage_ptr__,http *this,anon_class_8_1_65350a3f sender,int io,
          opcode op,span<const_unsigned_char,__1L> *span)

{
  unsigned_short uVar1;
  ulong uVar2;
  anon_class_8_1_65350a3f sender_00;
  anon_class_8_1_65350a3f sender_01;
  anon_class_8_1_65350a3f sender_02;
  undefined4 in_register_00000084;
  frame_fixed_layout *pfVar3;
  error_code eVar4;
  anon_class_16_2_9095cc0e f_00;
  error_code erc;
  error_or<int> local_60;
  error_or<int> *local_48;
  anon_class_8_1_65350a3f local_40;
  ulong local_38;
  index_type length;
  frame_fixed_layout *pfStack_28;
  frame_fixed_layout f;
  span<const_unsigned_char,__1L> *span_local;
  opcode op_local;
  int io_local;
  anon_class_8_1_65350a3f sender_local;
  
  pfVar3 = (frame_fixed_layout *)CONCAT44(in_register_00000084,op);
  span_local._4_4_ = (uint)sender.output;
  pfStack_28 = pfVar3;
  span_local._0_4_ = io;
  _op_local = (error_or<int> *)this;
  sender_local.output =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  memset((void *)((long)&length + 6),0,2);
  bit_field<unsigned_short,_15U,_1U>::operator=
            ((bit_field<unsigned_short,_15U,_1U> *)((long)&length + 6),true);
  bit_field<unsigned_short,12u,3u>::operator=
            ((bit_field<unsigned_short,12u,3u> *)((long)&length + 6),0);
  bit_field<unsigned_short,8u,4u>::operator=
            ((bit_field<unsigned_short,8u,4u> *)((long)&length + 6),(unsigned_short)(int)span_local)
  ;
  bit_field<unsigned_short,_7U,_1U>::operator=
            ((bit_field<unsigned_short,_7U,_1U> *)((long)&length + 6),false);
  uVar2 = pstore::gsl::span<const_unsigned_char,_-1L>::size
                    ((span<const_unsigned_char,__1L> *)&pfStack_28->payload_length);
  local_38 = uVar2;
  if ((long)uVar2 < 0x7e) {
    local_38._0_2_ = (unsigned_short)uVar2;
    uVar1 = (unsigned_short)local_38;
    bit_field<unsigned_short,0u,7u>::operator=
              ((bit_field<unsigned_short,0u,7u> *)((long)&length + 6),uVar1);
    local_48 = _op_local;
    local_40.output = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pfStack_28;
    sender_00.output._4_4_ = 0;
    sender_00.output._0_4_ = span_local._4_4_;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_60,(http *)_op_local,sender_00,(uint)length._6_2_,(unsigned_short)pfVar3);
    f_00.span = (span<const_unsigned_char,__1L> *)pfVar3;
    f_00.sender.output = local_40.output;
    pstore::operator>>=(__return_storage_ptr__,(pstore *)&local_60,local_48,f_00);
    error_or<int>::~error_or(&local_60);
  }
  else {
    uVar1 = std::numeric_limits<unsigned_short>::max();
    if ((long)(ulong)uVar1 < (long)uVar2) {
      if ((local_38 & 0x8000000000000000) == 0) {
        bit_field<unsigned_short,0u,7u>::operator=
                  ((bit_field<unsigned_short,0u,7u> *)((long)&length + 6),0x7f);
        sender_02.output._4_4_ = 0;
        sender_02.output._0_4_ = span_local._4_4_;
        details::send_extended_length_message<unsigned_long,WsServer_Ping_Test::TestBody()::__2,int>
                  (__return_storage_ptr__,(details *)_op_local,sender_02,(int)&length + 6,pfStack_28
                   ,span);
      }
      else {
        eVar4 = make_error_code(message_too_long);
        erc._M_cat = eVar4._M_cat;
        erc._4_4_ = 0;
        erc._M_value = eVar4._M_value;
        error_or<int>::error_or(__return_storage_ptr__,erc);
      }
    }
    else {
      bit_field<unsigned_short,0u,7u>::operator=
                ((bit_field<unsigned_short,0u,7u> *)((long)&length + 6),0x7e);
      sender_01.output._4_4_ = 0;
      sender_01.output._0_4_ = span_local._4_4_;
      details::send_extended_length_message<unsigned_short,WsServer_Ping_Test::TestBody()::__2,int>
                (__return_storage_ptr__,(details *)_op_local,sender_01,(int)&length + 6,pfStack_28,
                 span);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_message (Sender const sender, IO const io, opcode const op,
                                   gsl::span<std::uint8_t const> const & span) {
            frame_fixed_layout f{};
            f.fin = true;
            f.rsv = std::uint16_t{0};
            f.opcode = static_cast<std::uint16_t> (op);
            f.mask = false;

            auto const length = span.size ();
            if (length < 126) {
                f.payload_length = static_cast<std::uint16_t> (length);
                return send (sender, io, f.raw) >>=
                       [sender, &span] (IO io2) { return send (sender, io2, span); };
            }

            if (length <= std::numeric_limits<std::uint16_t>::max ()) {
                // Length is sent as 16-bits.
                f.payload_length = std::uint16_t{126};
                return details::send_extended_length_message<std::uint16_t> (sender, io, f, span);
            }

            // The payload length must not have the top bit set.
            if (static_cast<std::uint64_t> (length) & (std::uint64_t{1} << 63U)) {
                return error_or<IO>{make_error_code (ws_error::message_too_long)};
            }

            // Send the length as a full 64-bit value.
            f.payload_length = std::uint16_t{127};
            return details::send_extended_length_message<std::uint64_t> (sender, io, f, span);
        }